

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::UnitTest::UponLeavingGTest(UnitTest *this)

{
  UnitTestImpl *this_00;
  OsStackTraceGetterInterface *pOVar1;
  UnitTest *this_local;
  
  this_00 = impl(this);
  pOVar1 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
  (*pOVar1->_vptr_OsStackTraceGetterInterface[3])();
  return;
}

Assistant:

void UnitTest::UponLeavingGTest() {
  impl()->os_stack_trace_getter()->UponLeavingGTest();
}